

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O1

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle,uchar *buffer,size_t size)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  char cVar5;
  CONTROL_PACKET_TYPE CVar6;
  int iVar7;
  uchar *puVar8;
  size_t sVar9;
  long lVar10;
  BUFFER_HANDLE handle_00;
  LOGGER_LOG p_Var11;
  CONTROL_PACKET_TYPE CVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  size_t index;
  ulong uVar16;
  
  if (handle == (MQTTCODEC_HANDLE)0x0) {
    iVar7 = 0x425;
  }
  else if (size == 0 || buffer == (uchar *)0x0) {
    handle->currPacket = PACKET_TYPE_ERROR;
    iVar7 = 0x42c;
  }
  else {
    uVar16 = 0;
    do {
      bVar1 = buffer[uVar16];
      if (handle->codecState == CODEC_STATE_VAR_HEADER) {
        if (handle->headerData == (BUFFER_HANDLE)0x0) {
          handle->codecState = CODEC_STATE_PAYLOAD;
          bVar2 = true;
          iVar7 = 0;
        }
        else {
          puVar8 = BUFFER_u_char(handle->headerData);
          if (puVar8 == (uchar *)0x0) {
            handle->currPacket = PACKET_TYPE_ERROR;
            iVar7 = 0x48c;
            goto LAB_001652fb;
          }
          sVar9 = handle->bufferOffset;
          handle->bufferOffset = sVar9 + 1;
          puVar8[sVar9] = bVar1;
          sVar9 = BUFFER_length(handle->headerData);
          bVar2 = true;
          iVar7 = 0;
          if (sVar9 <= handle->bufferOffset) {
LAB_00165130:
            bVar2 = true;
            completePacketData(handle);
            iVar7 = 0;
          }
        }
        goto switchD_001650d2_caseD_30;
      }
      if (handle->codecState == CODEC_STATE_FIXED_HEADER) {
        if (handle->currPacket != UNKNOWN_TYPE) {
          sVar9 = handle->remainLenIndex;
          handle->remainLenIndex = sVar9 + 1;
          handle->storeRemainLen[sVar9] = bVar1;
          if ((char)bVar1 < '\0') {
            if (handle->remainLenIndex != 4) goto LAB_00165294;
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 != (LOGGER_LOG)0x0) {
              iVar7 = 0x246;
              pcVar15 = "MQTT packet len is invalid";
              goto LAB_001652ea;
            }
          }
          else {
            uVar14 = 0;
            lVar10 = -3;
            uVar4 = 1;
            do {
              uVar13 = uVar4;
              lVar3 = lVar10 + 3;
              uVar14 = (handle->storeRemainLen[lVar3] & 0x7f) * uVar13 + uVar14;
              if (lVar10 == 0) break;
              lVar10 = lVar10 + 1;
              uVar4 = uVar13 << 7;
            } while ((char)handle->storeRemainLen[lVar3] < '\0');
            if ((uVar13 < 0x4001) && (uVar14 < 0xffffff80)) {
              handle->codecState = CODEC_STATE_VAR_HEADER;
              handle->remainLenIndex = 0;
              handle->storeRemainLen[0] = '\0';
              handle->storeRemainLen[1] = '\0';
              handle->storeRemainLen[2] = '\0';
              handle->storeRemainLen[3] = '\0';
              if ((int)uVar14 < 1) {
LAB_00165294:
                bVar2 = true;
                iVar7 = 0;
                if (handle->currPacket == PINGRESP_TYPE) {
                  if (buffer[uVar16] == '\0') goto LAB_00165130;
                  handle->currPacket = PACKET_TYPE_ERROR;
                  iVar7 = 0x47a;
                  goto LAB_001652fb;
                }
                goto switchD_001650d2_caseD_30;
              }
              handle->bufferOffset = 0;
              handle_00 = BUFFER_new();
              handle->headerData = handle_00;
              if (handle_00 == (BUFFER_HANDLE)0x0) {
                p_Var11 = xlogging_get_log_function();
                if (p_Var11 != (LOGGER_LOG)0x0) {
                  iVar7 = 0x22f;
                  pcVar15 = "Failed BUFFER_new";
LAB_001652ea:
                  (*p_Var11)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                             ,"prepareheaderDataInfo",iVar7,1,pcVar15);
                }
              }
              else {
                iVar7 = BUFFER_pre_build(handle_00,(ulong)uVar14);
                if (iVar7 == 0) goto LAB_00165294;
                p_Var11 = xlogging_get_log_function();
                if (p_Var11 != (LOGGER_LOG)0x0) {
                  iVar7 = 0x237;
                  pcVar15 = "Failed BUFFER_pre_build";
                  goto LAB_001652ea;
                }
              }
            }
            else {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 != (LOGGER_LOG)0x0) {
                iVar7 = 0x21d;
                pcVar15 = "Receive buffer too large for MQTT packet";
                goto LAB_001652ea;
              }
            }
          }
          handle->currPacket = PACKET_TYPE_ERROR;
          iVar7 = 0x46d;
          goto LAB_001652fb;
        }
        CVar6 = (uint)bVar1 & 0xf;
        handle->headerFlags = CVar6;
        CVar12 = (uint)bVar1 & PACKET_INVALID2_TYPE;
        handle->currPacket = CVar12;
        bVar2 = true;
        cVar5 = (char)CVar6;
        iVar7 = 0;
        switch(CVar12) {
        case PACKET_INVALID1_TYPE:
        case PACKET_INVALID2_TYPE:
          handle->currPacket = PACKET_TYPE_ERROR;
          iVar7 = 0x442;
          goto LAB_001652fb;
        default:
          iVar7 = 0;
          if (cVar5 != '\0') {
            handle->currPacket = PACKET_TYPE_ERROR;
            iVar7 = 0x452;
            goto LAB_001652fb;
          }
          break;
        case PUBLISH_TYPE:
          break;
        case PUBREL_TYPE:
        case SUBSCRIBE_TYPE:
        case UNSUBSCRIBE_TYPE:
          iVar7 = 0;
          if (cVar5 != '\x02') {
            handle->currPacket = PACKET_TYPE_ERROR;
            iVar7 = 0x45c;
            goto LAB_001652fb;
          }
        }
      }
      else {
        handle->currPacket = PACKET_TYPE_ERROR;
        iVar7 = 0x4a1;
LAB_001652fb:
        bVar2 = false;
      }
switchD_001650d2_caseD_30:
      uVar16 = uVar16 + 1;
    } while ((uVar16 < size) && (bVar2));
  }
  return iVar7;
}

Assistant:

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle, const unsigned char* buffer, size_t size)
{
    int result;
    MQTTCODEC_INSTANCE* codec_Data = (MQTTCODEC_INSTANCE*)handle;
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    if (codec_Data == NULL)
    {
        result = MU_FAILURE;
    }
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    /* Codes_SRS_MQTT_CODEC_07_032: [If the parameters size is zero then mqtt_codec_bytesReceived shall return a non-zero value.] */
    else if (buffer == NULL || size == 0)
    {
        codec_Data->currPacket = PACKET_TYPE_ERROR;
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_033: [mqtt_codec_bytesReceived constructs a sequence of bytes into the corresponding MQTT packets and on success returns zero.] */
        result = 0;
        size_t index = 0;
        for (index = 0; index < size && result == 0; index++)
        {
            uint8_t iterator = ((int8_t*)buffer)[index];
            if (codec_Data->codecState == CODEC_STATE_FIXED_HEADER)
            {
                if (codec_Data->currPacket == UNKNOWN_TYPE)
                {
                    codec_Data->currPacket = processControlPacketType(iterator, &codec_Data->headerFlags);

                    // validate packet type and invalid reserved header flags
                    switch (codec_Data->currPacket)
                    {
                        case PACKET_INVALID1_TYPE:
                        case PACKET_INVALID2_TYPE:
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                            break;

                        case CONNECT_TYPE:
                        case CONNACK_TYPE:
                        case PUBACK_TYPE:
                        case PUBREC_TYPE:
                        case PUBCOMP_TYPE:
                        case SUBACK_TYPE:
                        case UNSUBACK_TYPE:
                        case PINGREQ_TYPE:
                        case PINGRESP_TYPE:
                        case DISCONNECT_TYPE:
                            if (codec_Data->headerFlags & 0x0F) // flags must be all zeros
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBREL_TYPE:
                        case SUBSCRIBE_TYPE:
                        case UNSUBSCRIBE_TYPE:
                            if ((codec_Data->headerFlags & 0x0F) != 0x02) // only bit 1 must be set
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBLISH_TYPE:
                        case CONTROL_PACKET_TYPE_INVALID: 
                        case PACKET_TYPE_ERROR:
                        case UNKNOWN_TYPE:
                            break;
                    }
                }
                else
                {
                    if (prepareheaderDataInfo(codec_Data, iterator) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else if (codec_Data->currPacket == PINGRESP_TYPE)
                    {
                        // PINGRESP must not have a payload
                        if (((int8_t*)buffer)[index] == 0)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                        else
                        {
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                        }
                    }
                }
            }
            else if (codec_Data->codecState == CODEC_STATE_VAR_HEADER)
            {
                if (codec_Data->headerData == NULL)
                {
                    codec_Data->codecState = CODEC_STATE_PAYLOAD;
                }
                else
                {
                    uint8_t* dataBytes = BUFFER_u_char(codec_Data->headerData);
                    if (dataBytes == NULL)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else
                    {
                        // Increment the data
                        dataBytes += codec_Data->bufferOffset++;
                        *dataBytes = iterator;

                        size_t totalLen = BUFFER_length(codec_Data->headerData);
                        if (codec_Data->bufferOffset >= totalLen)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                    }
                }
            }
            else
            {
                /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                codec_Data->currPacket = PACKET_TYPE_ERROR;
                result = MU_FAILURE;
            }
        }
    }
    return result;
}